

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_186c9d3::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  cmMakefile *this;
  uint *puVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  bool bVar4;
  ushort uVar5;
  ArrayIndex AVar6;
  ArrayIndex AVar7;
  int iVar8;
  ValueType VVar9;
  string *name;
  string *psVar10;
  string *psVar11;
  runtime_error *prVar12;
  Value *pVVar13;
  Value *this_00;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var17;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *value;
  Value *extraout_RDX_03;
  undefined8 uVar18;
  string_view error;
  string_view error_00;
  string_view error_01;
  string_view error_02;
  string_view error_03;
  string_view error_04;
  string_view error_05;
  string_view error_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view sVar19;
  const_iterator cVar20;
  Args path;
  Args path_00;
  Args path_01;
  string_view value_00;
  Args path_02;
  Args path_03;
  string_view value_01;
  Args path_04;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  Args args;
  Value newValue;
  Value json;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [2];
  ValueHolder local_b0;
  char *local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  char *local_60;
  undefined1 local_58 [24];
  undefined8 local_40;
  
  this = status->Makefile;
  _Stack_f0._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_f8._M_current =
       (arguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  sVar19._M_str = "missing out-var argument";
  sVar19._M_len = 0x18;
  name = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_f8,sVar19);
  if (((local_f8._M_current != _Stack_f0._M_current) &&
      (((string_view *)((long)local_f8._M_current + 8))->_M_len == 0xe)) &&
     (*(long *)((long)*(long **)local_f8._M_current + 6) == 0x454c424149524156 &&
      **(long **)local_f8._M_current == 0x41565f524f525245)) {
    (anonymous_namespace)::Args::PopFront_abi_cxx11_
              ((Args *)&local_f8,(string_view)(ZEXT816(0x909629) << 0x40));
    error_05._M_str = "missing error-var argument";
    error_05._M_len = 0x1a;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_f8,error_05);
    value_00._M_str = "NOTFOUND";
    value_00._M_len = 8;
    cmMakefile::AddDefinition(this,psVar10,value_00);
  }
  error._M_str = "missing mode argument";
  error._M_len = 0x15;
  psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_f8,error);
  if (3 < psVar10->_M_string_length - 3) goto LAB_00437ef9;
  puVar1 = (uint *)(psVar10->_M_dataplus)._M_p;
  switch(psVar10->_M_string_length) {
  case 3:
    if ((*(char *)((long)puVar1 + 2) != 'T' || (short)*puVar1 != 0x4547) &&
       (*(char *)((long)puVar1 + 2) != 'T' || (short)*puVar1 != 0x4553)) goto LAB_00437ef9;
    break;
  case 4:
    if (*puVar1 != 0x45505954) goto LAB_00437ef9;
    break;
  case 5:
    uVar15 = *puVar1 ^ 0x41555145;
    uVar5 = (byte)puVar1[1] ^ 0x4c;
LAB_00437ddc:
    if (uVar5 != 0 || uVar15 != 0) {
LAB_00437ef9:
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_68 = (undefined1  [8])0x15;
      local_60 = "got an invalid mode \'";
      local_b0.int_ = 0x41;
      local_a8 = "\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL";
      cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                ((string *)&local_e8,(static_string_view *)local_68,psVar10,
                 (static_string_view *)&local_b0);
      std::runtime_error::runtime_error(prVar12,(string *)local_e8._M_local_buf);
      *(undefined ***)prVar12 = &PTR__runtime_error_00b23588;
      prVar12[0x20] = (runtime_error)0x0;
      __cxa_throw(prVar12,&(anonymous_namespace)::json_error::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    break;
  case 6:
    if (((short)puVar1[1] != 0x5245 || *puVar1 != 0x424d454d) &&
       ((short)puVar1[1] != 0x4854 || *puVar1 != 0x474e454c)) {
      uVar15 = *puVar1 ^ 0x4f4d4552;
      uVar5 = (ushort)puVar1[1] ^ 0x4556;
      goto LAB_00437ddc;
    }
  }
  error_00._M_str = "missing json string argument";
  error_00._M_len = 0x1c;
  psVar11 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_f8,error_00);
  ReadJson((Value *)&local_b0,psVar11);
  uVar16 = psVar10->_M_string_length - 3;
  if (3 < uVar16) goto LAB_004384d7;
  puVar1 = (uint *)(psVar10->_M_dataplus)._M_p;
  path_01.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&switchD_00437e2b::switchdataD_008bce30 +
       (long)(int)(&switchD_00437e2b::switchdataD_008bce30)[uVar16]);
  switch(psVar10->_M_string_length) {
  case 3:
    path_03.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current._0_4_ = (ushort)*puVar1 ^ 0x4547;
    if (*(char *)((long)puVar1 + 2) == 'T' &&
        (short)(uint)path_03.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .End._M_current == 0) {
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f0._M_current;
      path_03.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current._4_4_ = 0;
      this_00 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,
                            (Value *)local_f8._M_current,path_03);
      bVar4 = Json::Value::isObject(this_00);
      pVVar13 = extraout_RDX_00;
      if ((bVar4) || (bVar4 = Json::Value::isArray(this_00), pVVar13 = extraout_RDX_01, bVar4)) {
        (anonymous_namespace)::WriteJson_abi_cxx11_
                  ((string *)&local_e8,(_anonymous_namespace_ *)this_00,pVVar13);
        value_01._M_str = (char *)local_e8._M_allocated_capacity;
        value_01._M_len = local_e8._8_8_;
        cmMakefile::AddDefinition(this,name,value_01);
      }
      else {
        bVar4 = Json::Value::isBool(this_00);
        if (bVar4) {
          bVar4 = Json::Value::asBool(this_00);
          cmMakefile::AddDefinitionBool(this,name,bVar4);
          goto LAB_004384d7;
        }
        Json::Value::asString_abi_cxx11_((String *)&local_e8,this_00);
        value_06._M_str = (char *)local_e8._M_allocated_capacity;
        value_06._M_len = local_e8._8_8_;
        cmMakefile::AddDefinition(this,name,value_06);
      }
      goto LAB_004384bc;
    }
    uVar15 = (ushort)*puVar1 ^ 0x4553;
    _Var17._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar15;
    if (*(char *)((long)puVar1 + 2) != 'T' || (short)uVar15 != 0) goto LAB_004384d7;
    error_01._M_str = "missing new value remove";
    error_01._M_len = 0x18;
    psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_f8,error_01);
    error_02._M_str = "missing member name to add";
    error_02._M_len = 0x1a;
    psVar11 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_f8,error_02);
    _Var3._M_current = _Stack_f0._M_current;
    _Var2._M_current = local_f8._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current = _Var17._M_current;
    path.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current = _Stack_f0._M_current;
    pVVar13 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,(Value *)local_f8._M_current
                          ,path);
    ReadJson((Value *)&local_e8,psVar10);
    bVar4 = Json::Value::isObject(pVVar13);
    if (bVar4) {
      pVVar13 = Json::Value::operator[](pVVar13,psVar11);
      Json::Value::operator=(pVVar13,(Value *)&local_e8);
      pVVar13 = extraout_RDX;
    }
    else {
      bVar4 = Json::Value::isArray(pVVar13);
      if (!bVar4) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
        VVar9 = Json::Value::type(pVVar13);
        local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
        local_68 = (undefined1  [8])0x44;
        local_60 = "SET needs to be called with an element of type OBJECT or ARRAY, got ";
        local_58._0_8_ = 0;
        local_40 = 0;
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_68;
        cmCatViews((string *)local_88,views_01);
        std::runtime_error::runtime_error(prVar12,(string *)local_88);
        *(undefined ***)prVar12 = &PTR__runtime_error_00b23588;
        prVar12[0x20] = (runtime_error)0x0;
        __cxa_throw(prVar12,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_60 = (char *)(_Var3._M_current + 1);
      local_68 = (undefined1  [8])_Var2._M_current;
      local_58[0] = 1;
      AVar7 = ParseIndex(psVar11,(optional<(anonymous_namespace)::Args> *)local_68,0xffffffff);
      bVar4 = Json::Value::isValidIndex(pVVar13,AVar7);
      if (bVar4) {
        pVVar13 = Json::Value::operator[](pVVar13,AVar7);
        Json::Value::operator=(pVVar13,(Value *)&local_e8);
        pVVar13 = extraout_RDX_02;
      }
      else {
        Json::Value::append(pVVar13,(Value *)&local_e8);
        pVVar13 = extraout_RDX_03;
      }
    }
    (anonymous_namespace)::WriteJson_abi_cxx11_
              ((string *)local_68,(_anonymous_namespace_ *)&local_b0.bool_,pVVar13);
    value_05._M_str = (char *)local_68;
    value_05._M_len = (size_t)local_60;
    cmMakefile::AddDefinition(this,name,value_05);
    if (local_68 != (undefined1  [8])local_58) {
      operator_delete((void *)local_68,local_58._0_8_ + 1);
    }
    break;
  case 4:
    if (*puVar1 == 0x45505954) {
      path_01.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f0._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,
                            (Value *)local_f8._M_current,path_01);
      VVar9 = Json::Value::type(pVVar13);
      sVar19 = JsonTypeToString(VVar9);
      cmMakefile::AddDefinition(this,name,sVar19);
    }
    goto LAB_004384d7;
  case 5:
    if ((char)puVar1[1] != 'L' || *puVar1 != 0x41555145) goto LAB_004384d7;
    error_03._M_str = "missing second json string argument";
    error_03._M_len = 0x23;
    psVar10 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)&local_f8,error_03);
    ReadJson((Value *)&local_e8,psVar10);
    bVar4 = Json::Value::operator==((Value *)&local_b0,(Value *)&local_e8);
    cmMakefile::AddDefinitionBool(this,name,bVar4);
    break;
  case 6:
    _Var17._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(*puVar1 ^ 0x424d454d);
    if ((ushort)puVar1[1] == 0x5245 && (*puVar1 ^ 0x424d454d) == 0) {
      error_06._M_str = "missing member index";
      error_06._M_len = 0x14;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_f8,error_06);
      _Var3._M_current = _Stack_f0._M_current;
      _Var2._M_current = local_f8._M_current;
      path_02.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var17._M_current;
      path_02.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f0._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,
                            (Value *)local_f8._M_current,path_02);
      bVar4 = Json::Value::isObject(pVVar13);
      if (!bVar4) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
        VVar9 = Json::Value::type(pVVar13);
        local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
        local_68 = (undefined1  [8])0x3e;
        local_60 = "MEMBER needs to be called with an element of type OBJECT, got ";
        local_58._0_8_ = 0;
        local_40 = 0;
        views._M_len = 2;
        views._M_array = (iterator)local_68;
        cmCatViews((string *)&local_e8,views);
        std::runtime_error::runtime_error(prVar12,(string *)local_e8._M_local_buf);
        *(undefined ***)prVar12 = &PTR__runtime_error_00b23588;
        *(undefined4 *)(prVar12 + 0x10) = local_f8._M_current._0_4_;
        *(undefined4 *)(prVar12 + 0x14) = local_f8._M_current._4_4_;
        *(undefined4 *)(prVar12 + 0x18) = _Stack_f0._M_current._0_4_;
        *(undefined4 *)(prVar12 + 0x1c) = _Stack_f0._M_current._4_4_;
        prVar12[0x20] = (runtime_error)0x1;
        __cxa_throw(prVar12,&(anonymous_namespace)::json_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      local_e8._8_8_ = _Var3._M_current + 1;
      local_e8._M_allocated_capacity = (size_type)_Var2._M_current;
      local_d8[0]._M_local_buf[0] = '\x01';
      AVar6 = Json::Value::size(pVVar13);
      iVar8 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)&local_e8,AVar6);
      cVar20 = Json::Value::begin(pVVar13);
      local_68 = (undefined1  [8])cVar20.super_ValueIteratorBase.current_._M_node;
      local_60 = (char *)CONCAT71(local_60._1_7_,cVar20.super_ValueIteratorBase.isNull_);
      if (iVar8 < 1) {
        if (iVar8 != 0) {
          do {
            Json::ValueIteratorBase::decrement((ValueIteratorBase *)local_68);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
        }
      }
      else {
        do {
          Json::ValueIteratorBase::increment((ValueIteratorBase *)local_68);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      local_88._0_8_ = local_68;
      local_88[8] = (bool)local_60._0_1_;
      Json::ValueIteratorBase::name_abi_cxx11_((String *)&local_e8,(ValueIteratorBase *)local_88);
      value_03._M_str = (char *)local_e8._M_allocated_capacity;
      value_03._M_len = local_e8._8_8_;
      cmMakefile::AddDefinition(this,name,value_03);
    }
    else {
      path_04.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current._0_4_ = *puVar1 ^ 0x474e454c;
      if ((ushort)puVar1[1] == 0x4854 &&
          (uint)path_04.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End._M_current == 0) {
        path_04.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current = _Stack_f0._M_current;
        path_04.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current._4_4_ = 0;
        pVVar13 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,
                              (Value *)local_f8._M_current,path_04);
        bVar4 = Json::Value::isArray(pVVar13);
        if ((!bVar4) && (bVar4 = Json::Value::isObject(pVVar13), !bVar4)) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
          VVar9 = Json::Value::type(pVVar13);
          local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
          local_68 = (undefined1  [8])0x47;
          local_60 = "LENGTH needs to be called with an element of type ARRAY or OBJECT, got ";
          local_58._0_8_ = 0;
          local_40 = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_68;
          cmCatViews((string *)&local_e8,views_00);
          std::runtime_error::runtime_error(prVar12,(string *)local_e8._M_local_buf);
          *(undefined ***)prVar12 = &PTR__runtime_error_00b23588;
          *(undefined4 *)(prVar12 + 0x10) = local_f8._M_current._0_4_;
          *(undefined4 *)(prVar12 + 0x14) = local_f8._M_current._4_4_;
          *(undefined4 *)(prVar12 + 0x18) = _Stack_f0._M_current._0_4_;
          *(undefined4 *)(prVar12 + 0x1c) = _Stack_f0._M_current._4_4_;
          prVar12[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar12,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        AVar6 = Json::Value::size(pVVar13);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_e8,AVar6);
        uVar14 = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar14 = local_e8._M_allocated_capacity;
        }
        uVar18 = &local_e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar18 = local_e8._M_allocated_capacity;
        }
        value_02._M_str = *(char **)uVar14;
        value_02._M_len = ((string_view *)(uVar18 + 8))->_M_len;
        cmMakefile::AddDefinition(this,name,value_02);
        goto LAB_004384d7;
      }
      _Var17._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)(*puVar1 ^ 0x4f4d4552);
      if ((ushort)puVar1[1] != 0x4556 || (*puVar1 ^ 0x4f4d4552) != 0) goto LAB_004384d7;
      error_04._M_str = "missing member or index to remove";
      error_04._M_len = 0x21;
      psVar10 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)&local_f8,error_04);
      _Var3._M_current = _Stack_f0._M_current;
      _Var2._M_current = local_f8._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var17._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current = _Stack_f0._M_current;
      pVVar13 = ResolvePath((anon_unknown_dwarf_186c9d3 *)&local_b0.bool_,
                            (Value *)local_f8._M_current,path_00);
      bVar4 = Json::Value::isArray(pVVar13);
      if (bVar4) {
        local_e8._8_8_ = _Var3._M_current + 1;
        local_e8._M_allocated_capacity = (size_type)_Var2._M_current;
        local_d8[0]._M_local_buf[0] = '\x01';
        AVar6 = Json::Value::size(pVVar13);
        AVar7 = ParseIndex(psVar10,(optional<(anonymous_namespace)::Args> *)&local_e8,AVar6);
        Json::Value::Value((Value *)&local_e8,nullValue);
        Json::Value::removeIndex(pVVar13,AVar7,(Value *)&local_e8);
      }
      else {
        bVar4 = Json::Value::isObject(pVVar13);
        if (!bVar4) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
          VVar9 = Json::Value::type(pVVar13);
          local_58._8_16_ = (undefined1  [16])JsonTypeToString(VVar9);
          local_68 = (undefined1  [8])0x47;
          local_60 = "REMOVE needs to be called with an element of type ARRAY or OBJECT, got ";
          local_58._0_8_ = 0;
          local_40 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_68;
          cmCatViews((string *)&local_e8,views_02);
          std::runtime_error::runtime_error(prVar12,(string *)local_e8._M_local_buf);
          *(undefined ***)prVar12 = &PTR__runtime_error_00b23588;
          *(undefined4 *)(prVar12 + 0x10) = local_f8._M_current._0_4_;
          *(undefined4 *)(prVar12 + 0x14) = local_f8._M_current._4_4_;
          *(undefined4 *)(prVar12 + 0x18) = _Stack_f0._M_current._0_4_;
          *(undefined4 *)(prVar12 + 0x1c) = _Stack_f0._M_current._4_4_;
          prVar12[0x20] = (runtime_error)0x1;
          __cxa_throw(prVar12,&(anonymous_namespace)::json_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Json::Value::Value((Value *)&local_e8,nullValue);
        Json::Value::removeMember(pVVar13,psVar10,(Value *)&local_e8);
      }
      Json::Value::~Value((Value *)&local_e8);
      (anonymous_namespace)::WriteJson_abi_cxx11_
                ((string *)&local_e8,(_anonymous_namespace_ *)&local_b0.bool_,value);
      value_04._M_str = (char *)local_e8._M_allocated_capacity;
      value_04._M_len = local_e8._8_8_;
      cmMakefile::AddDefinition(this,name,value_04);
    }
LAB_004384bc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT71(local_d8[0]._M_allocated_capacity._1_7_,local_d8[0]._M_local_buf[0])
                      + 1);
    }
    goto LAB_004384d7;
  }
  Json::Value::~Value((Value *)&local_e8);
LAB_004384d7:
  Json::Value::~Value((Value *)&local_b0);
  return true;
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        cmStrCat("got an invalid mode '"_s, mode,
                 "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
                 " EQUAL"_s));
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error(
          cmStrCat("MEMBER needs to be called with an element of "
                   "type OBJECT, got "_s,
                   JsonTypeToString(value.type())),
          args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error(cmStrCat("LENGTH needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error(cmStrCat("REMOVE needs to be called with an "
                                  "element of type ARRAY or OBJECT, got "_s,
                                  JsonTypeToString(value.type())),
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error(cmStrCat("SET needs to be called with an "
                                  "element of type OBJECT or ARRAY, got "_s,
                                  JsonTypeToString(value.type())));
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmStrCat(errorPath, "-NOTFOUND"_s));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmStrCat("sub-command JSON "_s, e.what(), "."_s));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}